

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  undefined8 uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte *in_RSI;
  undefined1 auVar4 [64];
  bool is_open;
  ImGuiViewport *viewport;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000394;
  bool *in_stack_00000398;
  char *in_stack_000003a0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  ImVec2 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  ImGuiPopupFlags popup_flags;
  ImGuiCond cond;
  ImGuiViewport *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  bool local_1;
  undefined1 extraout_var [56];
  
  pIVar2 = GImGui;
  popup_flags = (ImGuiPopupFlags)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  ImGuiWindow::GetID(GImGui->CurrentWindow,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (char *)in_stack_ffffffffffffffc0);
  bVar3 = IsPopupOpen((ImGuiID)in_stack_ffffffffffffffc0,popup_flags);
  if (bVar3) {
    if (((pIVar2->NextWindowData).Flags & 1U) == 0) {
      in_stack_ffffffffffffffc0 = GetMainViewport();
      auVar4._0_8_ = ImGuiViewport::GetCenter
                               ((ImGuiViewport *)
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      auVar4._8_56_ = extraout_var;
      uVar1 = vmovlpd_avx(auVar4._0_16_);
      cond = (ImGuiCond)((ulong)uVar1 >> 0x20);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb0,0.5,0.5);
      SetNextWindowPos((ImVec2 *)in_stack_ffffffffffffffc0,cond,(ImVec2 *)in_stack_ffffffffffffffb0)
      ;
    }
    local_1 = Begin(in_stack_000003a0,in_stack_00000398,in_stack_00000394);
    if ((!local_1) || ((in_RSI != (byte *)0x0 && ((*in_RSI & 1) == 0)))) {
      EndPopup();
      if ((local_1 & 1U) != 0) {
        ClosePopupToLevel((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                          SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x18,0));
      }
      local_1 = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&pIVar2->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}